

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

string * getLastLine_abi_cxx11_(string *__return_storage_ptr__,ifstream *in)

{
  char cVar1;
  istream *piVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  
  auVar6 = std::istream::tellg();
  do {
    uVar5 = auVar6._8_8_;
    uVar4 = auVar6._0_8_;
    piVar2 = std::ws<char,std::char_traits<char>>((istream *)in);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    auVar6 = std::istream::tellg();
    plVar3 = (long *)std::istream::ignore((long)in,-1);
  } while ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0);
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg(in,uVar4,uVar5);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)in,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getLastLine(std::ifstream& in)
{
    std::ifstream::pos_type pos = in.tellg();

    std::ifstream::pos_type lastPos;
    while (in >> std::ws && ignoreline(in, lastPos))
        pos = lastPos;

    in.clear();
    in.seekg(pos);

    std::string line;
    std::getline(in, line);
    return line;
}